

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintTools.h
# Opt level: O0

void PrintTools::PrintVectorCout<bool>(vector<bool,_std::allocator<bool>_> *v)

{
  ostream *this;
  vector<bool,_std::allocator<bool>_> *in_stack_00000218;
  string local_28 [40];
  
  SoftPrintVector<bool>(in_stack_00000218);
  this = std::operator<<((ostream *)&std::cout,local_28);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

static void PrintVectorCout(const std::vector<T> &v)
{
    std::cout << SoftPrintVector(v) << std::endl;
}